

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npy.h
# Opt level: O0

string * __thiscall
npy::pyparse::write_boolean_abi_cxx11_(string *__return_storage_ptr__,pyparse *this,bool b)

{
  allocator local_25 [19];
  allocator local_12;
  byte local_11;
  string *psStack_10;
  bool b_local;
  
  local_11 = (byte)this & 1;
  psStack_10 = __return_storage_ptr__;
  if (((ulong)this & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"False",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"True",&local_12);
    std::allocator<char>::~allocator((allocator<char> *)&local_12);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string write_boolean(bool b)
{
    if (b)
        return "True";
    else
        return "False";
}